

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O2

VisionFeaturePrint * __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint::New(VisionFeaturePrint *this,Arena *arena)

{
  VisionFeaturePrint *this_00;
  
  this_00 = (VisionFeaturePrint *)operator_new(0x20);
  VisionFeaturePrint(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::CoreMLModels::VisionFeaturePrint>
              (arena,this_00);
  }
  return this_00;
}

Assistant:

VisionFeaturePrint* VisionFeaturePrint::New(::google::protobuf::Arena* arena) const {
  VisionFeaturePrint* n = new VisionFeaturePrint;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}